

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::Statistics::Statistics(Statistics *this)

{
  TBase *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__Statistics_00c010d8;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__Statistics_00c010d8;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  in_RDI[9]._vptr_TBase = (_func_int **)0x0;
  in_RDI[10]._vptr_TBase = (_func_int **)0x0;
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  *(undefined1 *)&in_RDI[0x13]._vptr_TBase = 0;
  *(undefined1 *)((long)&in_RDI[0x13]._vptr_TBase + 1) = 0;
  _Statistics__isset::_Statistics__isset
            ((_Statistics__isset *)((long)&in_RDI[0x13]._vptr_TBase + 2));
  return;
}

Assistant:

Statistics::Statistics() noexcept
   : max(),
     min(),
     null_count(0),
     distinct_count(0),
     max_value(),
     min_value(),
     is_max_value_exact(0),
     is_min_value_exact(0) {
}